

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-activation.c
# Opt level: O3

int borg_findact(char *act_name)

{
  wchar_t wVar1;
  char *what;
  activation *paVar2;
  
  paVar2 = activations + 1;
  do {
    wVar1 = my_stricmp(paVar2->name,act_name);
    if (wVar1 == L'\0') {
      return paVar2->index;
    }
    paVar2 = paVar2->next;
  } while (paVar2 != (activation *)0x0);
  what = format("**STARTUP FAILURE** activation lookup failure - %s ",act_name);
  borg_note(what);
  borg_init_failure = true;
  return 0;
}

Assistant:

int borg_findact(const char *act_name)
{
    struct activation *act = &activations[1];
    while (act) {
        if (!my_stricmp(act->name, act_name)) {
            return act->index;
        }
        act = act->next;
    }

    borg_note(format(
        "**STARTUP FAILURE** activation lookup failure - %s ", act_name));
    borg_init_failure = true;
    return 0;
}